

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void tcg_prologue_init_mips(TCGContext_conflict3 *s)

{
  tcg_insn_unit *ptVar1;
  size_t sVar2;
  tcg_insn_unit *buf;
  tcg_target_long val;
  tcg_target_long val_00;
  ulong uVar3;
  long lVar4;
  
  ptVar1 = (tcg_insn_unit *)s->code_gen_buffer;
  sVar2 = s->code_gen_buffer_size;
  s->code_ptr = ptVar1;
  s->code_buf = ptVar1;
  s->data_gen_ptr = (void *)0x0;
  s->code_gen_prologue = ptVar1;
  s->code_gen_highwater = ptVar1 + (sVar2 - s->uc->qemu_real_host_page_size) + -0x400;
  s->pool_labels = (TCGLabelPoolData *)0x0;
  tcg_set_frame_mips(s,TCG_REG_CALL_STACK,0x80,0x400);
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 4) {
    tcg_out_push(s,*(int *)((long)tcg_target_callee_save_regs + lVar4));
  }
  uVar3 = 5;
  tcg_out_modrm(s,0x108b,5,7);
  tcg_out_addi(s,-0x488,val);
  tcg_out_modrm(s,0xff,4,6);
  s->code_gen_epilogue = s->code_ptr;
  tcg_out_modrm(s,0x33,0,0);
  s->tb_ret_addr = s->code_ptr;
  tcg_out_addi(s,0x488,val_00);
  if (have_avx2_mips == true) {
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = 0xc5;
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = 0xf8;
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = 'w';
  }
  for (; -1 < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
    tcg_out_opc(s,tcg_target_callee_save_regs[uVar3] & 7U | 0x58,0,
                tcg_target_callee_save_regs[uVar3],0);
  }
  ptVar1 = s->code_ptr;
  s->code_ptr = ptVar1 + 1;
  *ptVar1 = 0xc3;
  tcg_out_pool_finalize(s);
  ptVar1 = s->code_buf;
  buf = s->code_ptr;
  s->code_gen_ptr = buf;
  s->code_gen_buffer = buf;
  s->code_buf = buf;
  s->code_gen_buffer_size = (size_t)(ptVar1 + (sVar2 - (long)buf));
  tcg_register_jit_mips(s,buf,(size_t)(ptVar1 + (sVar2 - (long)buf)));
  return;
}

Assistant:

void tcg_prologue_init(TCGContext *s)
{
    size_t prologue_size, total_size;
    void *buf0, *buf1;

    /* Put the prologue at the beginning of code_gen_buffer.  */
    buf0 = s->code_gen_buffer;
    total_size = s->code_gen_buffer_size;
    s->code_ptr = buf0;
    s->code_buf = buf0;
    s->data_gen_ptr = NULL;
    s->code_gen_prologue = buf0;

    /* Compute a high-water mark, at which we voluntarily flush the buffer
       and start over.  The size here is arbitrary, significantly larger
       than we expect the code generation for any one opcode to require.  */
    s->code_gen_highwater = (char *)s->code_gen_buffer + (total_size - TCG_HIGHWATER) - s->uc->qemu_real_host_page_size;

#ifdef TCG_TARGET_NEED_POOL_LABELS
    s->pool_labels = NULL;
#endif

    /* Generate the prologue.  */
    tcg_target_qemu_prologue(s);

#ifdef TCG_TARGET_NEED_POOL_LABELS
    /* Allow the prologue to put e.g. guest_base into a pool entry.  */
    {
        int result = tcg_out_pool_finalize(s);
        tcg_debug_assert(result == 0);
    }
#endif

    buf1 = s->code_ptr;
    flush_icache_range((uintptr_t)buf0, (uintptr_t)buf1);

    /* Deduct the prologue from the buffer.  */
    prologue_size = tcg_current_code_size(s);
    s->code_gen_ptr = buf1;
    s->code_gen_buffer = buf1;
    s->code_buf = buf1;
    total_size -= prologue_size;
    s->code_gen_buffer_size = total_size;

    tcg_register_jit(s, s->code_gen_buffer, total_size);

    /* Assert that goto_ptr is implemented completely.  */
    if (TCG_TARGET_HAS_goto_ptr) {
        tcg_debug_assert(s->code_gen_epilogue != NULL);
    }
}